

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ml_sse3.c
# Opt level: O3

void av1_nn_fast_softmax_16_sse3(float *input,float *output)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  __m128 multiplier;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar9 [16];
  
  auVar1 = *(undefined1 (*) [16])input;
  auVar2 = *(undefined1 (*) [16])(input + 4);
  auVar3 = *(undefined1 (*) [16])(input + 8);
  auVar5 = *(undefined1 (*) [16])(input + 0xc);
  auVar7 = maxps(auVar1,auVar2);
  auVar10 = maxps(auVar3,auVar5);
  auVar7 = maxps(auVar7,auVar10);
  auVar11._0_8_ = auVar7._8_8_;
  auVar11._8_4_ = auVar7._0_4_;
  auVar11._12_4_ = auVar7._4_4_;
  auVar7 = maxps(auVar7,auVar11);
  auVar12._4_4_ = auVar7._0_4_;
  auVar12._0_4_ = auVar7._4_4_;
  auVar12._8_4_ = auVar7._12_4_;
  auVar12._12_4_ = auVar7._8_4_;
  auVar7 = maxps(auVar7,auVar12);
  fVar13 = auVar7._0_4_;
  auVar4._0_4_ = auVar1._0_4_ - fVar13;
  fVar14 = auVar7._4_4_;
  auVar4._4_4_ = auVar1._4_4_ - fVar14;
  fVar15 = auVar7._8_4_;
  auVar4._8_4_ = auVar1._8_4_ - fVar15;
  fVar16 = auVar7._12_4_;
  auVar4._12_4_ = auVar1._12_4_ - fVar16;
  auVar10._0_4_ = auVar2._0_4_ - fVar13;
  auVar10._4_4_ = auVar2._4_4_ - fVar14;
  auVar10._8_4_ = auVar2._8_4_ - fVar15;
  auVar10._12_4_ = auVar2._12_4_ - fVar16;
  auVar7._0_4_ = auVar3._0_4_ - fVar13;
  auVar7._4_4_ = auVar3._4_4_ - fVar14;
  auVar7._8_4_ = auVar3._8_4_ - fVar15;
  auVar7._12_4_ = auVar3._12_4_ - fVar16;
  auVar1._0_4_ = auVar5._0_4_ - fVar13;
  auVar1._4_4_ = auVar5._4_4_ - fVar14;
  auVar1._8_4_ = auVar5._8_4_ - fVar15;
  auVar1._12_4_ = auVar5._12_4_ - fVar16;
  auVar5 = maxps(auVar4,_DAT_00d97410);
  auVar3 = maxps(auVar10,_DAT_00d97410);
  auVar2 = maxps(auVar7,_DAT_00d97410);
  auVar1 = maxps(auVar1,_DAT_00d97410);
  auVar6._0_4_ = (float)((int)(auVar5._0_4_ * 12102203.0) + 0x3f7f127f);
  auVar6._4_4_ = (float)((int)(auVar5._4_4_ * 12102203.0) + 0x3f7f127f);
  auVar6._8_4_ = (float)((int)(auVar5._8_4_ * 12102203.0) + 0x3f7f127f);
  auVar6._12_4_ = (float)((int)(auVar5._12_4_ * 12102203.0) + 0x3f7f127f);
  auVar5._0_4_ = (float)((int)(auVar3._0_4_ * 12102203.0) + 0x3f7f127f);
  auVar5._4_4_ = (float)((int)(auVar3._4_4_ * 12102203.0) + 0x3f7f127f);
  auVar5._8_4_ = (float)((int)(auVar3._8_4_ * 12102203.0) + 0x3f7f127f);
  auVar5._12_4_ = (float)((int)(auVar3._12_4_ * 12102203.0) + 0x3f7f127f);
  auVar3._0_4_ = (float)((int)(auVar2._0_4_ * 12102203.0) + 0x3f7f127f);
  auVar3._4_4_ = (float)((int)(auVar2._4_4_ * 12102203.0) + 0x3f7f127f);
  auVar3._8_4_ = (float)((int)(auVar2._8_4_ * 12102203.0) + 0x3f7f127f);
  auVar3._12_4_ = (float)((int)(auVar2._12_4_ * 12102203.0) + 0x3f7f127f);
  auVar2._0_4_ = (float)((int)(auVar1._0_4_ * 12102203.0) + 0x3f7f127f);
  auVar2._4_4_ = (float)((int)(auVar1._4_4_ * 12102203.0) + 0x3f7f127f);
  auVar2._8_4_ = (float)((int)(auVar1._8_4_ * 12102203.0) + 0x3f7f127f);
  auVar2._12_4_ = (float)((int)(auVar1._12_4_ * 12102203.0) + 0x3f7f127f);
  fVar13 = auVar6._0_4_ + auVar5._0_4_ + auVar3._0_4_ + auVar2._0_4_;
  fVar14 = auVar6._4_4_ + auVar5._4_4_ + auVar3._4_4_ + auVar2._4_4_;
  fVar15 = auVar6._8_4_ + auVar5._8_4_ + auVar3._8_4_ + auVar2._8_4_;
  fVar16 = auVar6._12_4_ + auVar5._12_4_ + auVar3._12_4_ + auVar2._12_4_;
  auVar8._0_4_ = fVar15 + fVar13 + fVar16 + fVar14;
  auVar9._4_4_ = fVar13 + fVar15 + fVar14 + fVar16;
  auVar9._0_4_ = auVar8._0_4_;
  auVar9._8_4_ = auVar9._4_4_;
  auVar9._12_4_ = auVar9._4_4_;
  auVar8._8_8_ = auVar9._8_8_;
  auVar8._4_4_ = auVar8._0_4_;
  auVar7 = divps(auVar6,auVar8);
  auVar5 = divps(auVar5,auVar8);
  auVar3 = divps(auVar3,auVar8);
  auVar1 = divps(auVar2,auVar8);
  *(undefined1 (*) [16])output = auVar7;
  *(undefined1 (*) [16])(output + 4) = auVar5;
  *(undefined1 (*) [16])(output + 8) = auVar3;
  *(undefined1 (*) [16])(output + 0xc) = auVar1;
  return;
}

Assistant:

void av1_nn_fast_softmax_16_sse3(const float *input, float *output) {
  // Clips at -10 to avoid underflowing
  const __m128 clipper = _mm_set1_ps(-10.0f);

  // Load in 16 values
  __m128 in_0 = _mm_loadu_ps(&input[0]);
  __m128 in_1 = _mm_loadu_ps(&input[4]);
  __m128 in_2 = _mm_loadu_ps(&input[8]);
  __m128 in_3 = _mm_loadu_ps(&input[12]);

  // Get the max
  __m128 max_0 = _mm_max_ps(in_0, in_1);
  __m128 max_1 = _mm_max_ps(in_2, in_3);

  max_0 = _mm_max_ps(max_0, max_1);
  max_0 = reduce_max(max_0);

  // Subtract the max off and clip
  in_0 = _mm_sub_ps(in_0, max_0);
  in_1 = _mm_sub_ps(in_1, max_0);
  in_2 = _mm_sub_ps(in_2, max_0);
  in_3 = _mm_sub_ps(in_3, max_0);

  in_0 = _mm_max_ps(in_0, clipper);
  in_1 = _mm_max_ps(in_1, clipper);
  in_2 = _mm_max_ps(in_2, clipper);
  in_3 = _mm_max_ps(in_3, clipper);

  // Exponentiate and compute the denominator
  __m128 sum = in_0 = approx_exp(in_0);
  in_1 = approx_exp(in_1);
  sum = _mm_add_ps(sum, in_1);
  in_2 = approx_exp(in_2);
  sum = _mm_add_ps(sum, in_2);
  in_3 = approx_exp(in_3);
  sum = _mm_add_ps(sum, in_3);
  sum = reduce_sum(sum);

  // Divide to get the probability
  in_0 = _mm_div_ps(in_0, sum);
  in_1 = _mm_div_ps(in_1, sum);
  in_2 = _mm_div_ps(in_2, sum);
  in_3 = _mm_div_ps(in_3, sum);

  _mm_storeu_ps(&output[0], in_0);
  _mm_storeu_ps(&output[4], in_1);
  _mm_storeu_ps(&output[8], in_2);
  _mm_storeu_ps(&output[12], in_3);
}